

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O1

void __thiscall
solitaire::graphics::Renderer::renderCard(Renderer *this,Position *position,Card *card)

{
  GraphicsSystem *pGVar1;
  Value VVar2;
  Suit SVar3;
  uint local_3c;
  undefined8 local_38;
  undefined8 local_30;
  
  pGVar1 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  local_3c = (this->cardsId).t;
  VVar2 = solitaire::cards::Card::getValue(card);
  SVar3 = solitaire::cards::Card::getSuit(card);
  local_38 = CONCAT44(SVar3 * 0x68,VVar2 * 0x4b);
  local_30 = 0x680000004b;
  (*pGVar1->_vptr_GraphicsSystem[5])(pGVar1,&local_3c,position);
  return;
}

Assistant:

void Renderer::renderCard(const Position& position, const Card& card) const {
    graphicsSystem->renderTexture(
        cardsId, position, getCardTextureArea(card));
}